

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  ReusableStringStream *pRVar3;
  IResultCapture *capture;
  SourceLineInfo *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa0;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[2])();
  if ((IResultCapture *)CONCAT44(extraout_var,iVar1) != (IResultCapture *)0x0) {
    return (IResultCapture *)CONCAT44(extraout_var,iVar1);
  }
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&stack0xffffffffffffffb0,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/catch.hpp",
             0x335f);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pRVar3 = ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff80,(char (*) [26])in_stack_ffffffffffffff78);
  pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [27])in_stack_ffffffffffffff78);
  ReusableStringStream::str_abi_cxx11_(pRVar3);
  throw_logic_error(in_stack_ffffffffffffffa0);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }